

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_make_custom_port
          (sexp_conflict ctx,sexp_conflict self,char *mode,sexp_conflict read,sexp_conflict write,
          sexp_conflict seek,sexp_conflict close)

{
  sexp_conflict psVar1;
  sexp_conflict res;
  sexp_conflict str;
  sexp_conflict local_68;
  sexp local_60;
  sexp_conflict local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &local_68;
  local_68 = (sexp_conflict)0x43e;
  local_40.var = &local_58;
  local_58 = (sexp_conflict)0x43e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_60 = seek;
  local_58 = (sexp_conflict)sexp_make_string_op(ctx,0,2,0x2001,0x43e);
  if ((((ulong)local_58 & 3) != 0) || (psVar1 = local_58, local_58->tag != 0x13)) {
    local_68 = (sexp_conflict)sexp_open_input_string_op(ctx,0,1);
    if ((((ulong)local_68 & 3) != 0) || (psVar1 = local_68, local_68->tag != 0x13)) {
      if ((self == (sexp_conflict)0x0) || ((char)self->tag != 'w')) {
        (local_68->value).type.print = (sexp)0x0;
        (local_68->value).port.size = 0;
      }
      else {
        local_68->tag = 0x11;
        (local_68->value).type.cpl = local_58;
      }
      psVar1 = (sexp_conflict)sexp_make_vector_op(ctx,0,2,0xd,0x43e);
      if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
        (psVar1->value).string.offset = 0x3e;
        (psVar1->value).type.slots = (local_68->value).type.cpl;
        (psVar1->value).type.getters = (sexp)mode;
        (psVar1->value).type.setters = read;
        (psVar1->value).type.id = write;
        (psVar1->value).type.print = local_60;
        (local_68->value).type.cpl = psVar1;
        (ctx->value).context.saves = local_50.next;
        psVar1 = local_68;
      }
    }
  }
  return psVar1;
}

Assistant:

static sexp sexp_make_custom_port (sexp ctx, sexp self,
                                   const char *mode, sexp read, sexp write,
                                   sexp seek, sexp close) {
  sexp vec;
  sexp_gc_var2(res, str);
  sexp_gc_preserve2(ctx, res, str);
  str = sexp_make_string(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
  if (sexp_exceptionp(str)) return str;
  res = sexp_open_input_string(ctx, str);
  if (sexp_exceptionp(res)) return res;
  if (mode && mode[0] == 'w') {
    sexp_pointer_tag(res) = SEXP_OPORT;
    sexp_port_cookie(res) = str;
  } else {
    sexp_port_offset(res) = 0;
    sexp_port_size(res) = 0;
  }
  vec = sexp_make_vector(ctx, SEXP_SIX, SEXP_VOID);
  if (sexp_exceptionp(vec)) return vec;
  sexp_vector_set(vec, SEXP_ZERO, SEXP_FALSE);
  sexp_vector_set(vec, SEXP_ONE, sexp_port_cookie(res));
  sexp_vector_set(vec, SEXP_TWO, read);
  sexp_vector_set(vec, SEXP_THREE, write);
  sexp_vector_set(vec, SEXP_FOUR, seek);
  sexp_vector_set(vec, SEXP_FIVE, close);
  sexp_port_cookie(res) = vec;
  sexp_gc_release2(ctx);
  return res;
}